

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_multiple_seq_cst.h
# Opt level: O0

Allocation * __thiscall
density::detail::
LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)0>
          (Allocation *__return_storage_ptr__,
          LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
          *this,uintptr_t i_control_bits,bool i_include_type,size_t i_size,size_t i_alignment)

{
  ControlBlock *pCVar1;
  unsigned_long uVar2;
  bool bVar3;
  memory_order mVar4;
  size_t i_offset;
  void *pvVar5;
  void *pvVar6;
  __int_type _Var7;
  unsigned_long local_210;
  uintptr_t expected_next;
  __int_type updated_tail;
  ControlBlock *pCStack_1f8;
  PinResult pin_result;
  unsigned_long next;
  ControlBlock *incomplete_control;
  unsigned_long clean_tail;
  undefined4 local_1cc;
  void *local_1c8;
  void *user_storage;
  unsigned_long transient_tail;
  unsigned_long future_tail_offset;
  unsigned_long page_start;
  unsigned_long future_tail;
  ControlBlock *new_control;
  unsigned_long rest;
  __int_type tail;
  undefined1 local_180 [7];
  bool fits_in_page;
  PinGuard<density::basic_default_allocator<65536UL>,_(density::progress_guarantee)0> scoped_pin;
  unsigned_long required_units;
  unsigned_long required_size;
  uintptr_t overhead;
  size_t sStack_150;
  LfQueue_ProgressGuarantee guarantee;
  size_t i_alignment_local;
  size_t i_size_local;
  bool i_include_type_local;
  uintptr_t i_control_bits_local;
  LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  *this_local;
  memory_order __b_1;
  memory_order __b;
  
  if ((i_control_bits & 0xfffffffffffffff8) != 0) {
    density_tests::detail::assert_failed<>
              ("(i_control_bits & ~(LfQueue_Busy | LfQueue_Dead | LfQueue_External)) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_seq_cst.h"
               ,0x80);
  }
  bVar3 = is_power_of_2(i_alignment);
  if ((!bVar3) || (i_size % i_alignment != 0)) {
    density_tests::detail::assert_failed<>
              ("is_power_of_2(i_alignment) && (i_size % i_alignment) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_seq_cst.h"
               ,0x81);
  }
  sStack_150 = i_alignment;
  i_alignment_local = i_size;
  if (i_alignment < 8) {
    sStack_150 = 8;
    i_alignment_local = uint_upper_align<unsigned_long>(i_size,8);
  }
  i_offset = 8;
  if (i_include_type) {
    i_offset = 0x18;
  }
  scoped_pin.m_pinned_page = (void *)(i_offset + i_alignment_local + sStack_150 + 0x37 >> 6);
  PinGuard<density::basic_default_allocator<65536UL>,_(density::progress_guarantee)0>::PinGuard
            ((PinGuard<density::basic_default_allocator<65536UL>,_(density::progress_guarantee)0> *)
             local_180,(basic_default_allocator<65536UL> *)this);
  pvVar6 = scoped_pin.m_pinned_page;
  pvVar5 = (void *)size_min(0x40,0x3ff);
  tail._7_1_ = pvVar6 < pvVar5;
  if ((bool)tail._7_1_) {
    std::operator&(memory_order_seq_cst,__memory_order_mask);
    _Var7 = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
LAB_02165b96:
    do {
      rest = _Var7;
      new_control = (ControlBlock *)(rest & 0x3f);
      if (new_control != (ControlBlock *)0x0) {
        next = rest - (long)new_control;
        pCStack_1f8 = (ControlBlock *)(next + (long)new_control * 8 * 8);
        incomplete_control = (ControlBlock *)next;
        updated_tail._4_4_ =
             PinGuard<density::basic_default_allocator<65536UL>,_(density::progress_guarantee)0>::
             pin((PinGuard<density::basic_default_allocator<65536UL>,_(density::progress_guarantee)0>
                  *)local_180,(void *)next);
        if (updated_tail._4_4_ != AlreadyPinned) {
          if (updated_tail._4_4_ == PinFailed) {
            LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
            ::Allocation::Allocation(__return_storage_ptr__);
            goto LAB_0216739f;
          }
          std::operator&(memory_order_seq_cst,__memory_order_mask);
          expected_next = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
          _Var7 = expected_next;
          if (expected_next != rest) goto LAB_02165b96;
        }
        local_210 = 0;
        raw_atomic_compare_exchange_weak<unsigned_long>
                  ((unsigned_long *)next,&local_210,(unsigned_long)((long)&pCStack_1f8->m_next + 1),
                   memory_order_seq_cst);
        pCVar1 = pCStack_1f8;
        mVar4 = std::__cmpexch_failure_order(memory_order_seq_cst);
        switch(0x2166e2a) {
        default:
          if (mVar4 - memory_order_consume < 2) {
            LOCK();
            _Var7 = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
            bVar3 = rest == _Var7;
            if (bVar3) {
              (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pCVar1;
              _Var7 = rest;
            }
            UNLOCK();
            if (!bVar3) {
              rest = _Var7;
            }
          }
          else if (mVar4 == memory_order_seq_cst) {
            LOCK();
            _Var7 = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
            bVar3 = rest == _Var7;
            if (bVar3) {
              (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pCVar1;
              _Var7 = rest;
            }
            UNLOCK();
            if (!bVar3) {
              rest = _Var7;
            }
          }
          else {
            LOCK();
            _Var7 = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
            bVar3 = rest == _Var7;
            if (bVar3) {
              (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pCVar1;
              _Var7 = rest;
            }
            UNLOCK();
            if (!bVar3) {
              rest = _Var7;
            }
          }
          break;
        case 2:
          if (mVar4 - memory_order_consume < 2) {
            LOCK();
            _Var7 = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
            bVar3 = rest == _Var7;
            if (bVar3) {
              (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pCVar1;
              _Var7 = rest;
            }
            UNLOCK();
            if (!bVar3) {
              rest = _Var7;
            }
          }
          else if (mVar4 == memory_order_seq_cst) {
            LOCK();
            _Var7 = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
            bVar3 = rest == _Var7;
            if (bVar3) {
              (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pCVar1;
              _Var7 = rest;
            }
            UNLOCK();
            if (!bVar3) {
              rest = _Var7;
            }
          }
          else {
            LOCK();
            _Var7 = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
            bVar3 = rest == _Var7;
            if (bVar3) {
              (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pCVar1;
              _Var7 = rest;
            }
            UNLOCK();
            if (!bVar3) {
              rest = _Var7;
            }
          }
          break;
        case 3:
          if (mVar4 - memory_order_consume < 2) {
            LOCK();
            _Var7 = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
            bVar3 = rest == _Var7;
            if (bVar3) {
              (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pCVar1;
              _Var7 = rest;
            }
            UNLOCK();
            if (!bVar3) {
              rest = _Var7;
            }
          }
          else if (mVar4 == memory_order_seq_cst) {
            LOCK();
            _Var7 = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
            bVar3 = rest == _Var7;
            if (bVar3) {
              (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pCVar1;
              _Var7 = rest;
            }
            UNLOCK();
            if (!bVar3) {
              rest = _Var7;
            }
          }
          else {
            LOCK();
            _Var7 = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
            bVar3 = rest == _Var7;
            if (bVar3) {
              (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pCVar1;
              _Var7 = rest;
            }
            UNLOCK();
            if (!bVar3) {
              rest = _Var7;
            }
          }
          break;
        case 4:
          if (mVar4 - memory_order_consume < 2) {
            LOCK();
            _Var7 = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
            bVar3 = rest == _Var7;
            if (bVar3) {
              (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pCVar1;
              _Var7 = rest;
            }
            UNLOCK();
            if (!bVar3) {
              rest = _Var7;
            }
          }
          else if (mVar4 == memory_order_seq_cst) {
            LOCK();
            _Var7 = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
            bVar3 = rest == _Var7;
            if (bVar3) {
              (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pCVar1;
              _Var7 = rest;
            }
            UNLOCK();
            if (!bVar3) {
              rest = _Var7;
            }
          }
          else {
            LOCK();
            _Var7 = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
            bVar3 = rest == _Var7;
            if (bVar3) {
              (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pCVar1;
              _Var7 = rest;
            }
            UNLOCK();
            if (!bVar3) {
              rest = _Var7;
            }
          }
        }
        _Var7 = rest;
        if (bVar3) {
          rest = (unsigned_long)pCStack_1f8;
          _Var7 = rest;
        }
        goto LAB_02165b96;
      }
      future_tail = rest;
      page_start = rest + (long)scoped_pin.m_pinned_page * 0x40;
      future_tail_offset = uint_lower_align<unsigned_long>(rest,0x10000);
      transient_tail = page_start - future_tail_offset;
      pvVar6 = (void *)(rest + (long)scoped_pin.m_pinned_page);
      user_storage = pvVar6;
      if (0xffc0 < transient_tail) {
        _Var7 = page_overflow(this,LfQueue_Throwing,rest);
        goto LAB_02165b96;
      }
      mVar4 = std::__cmpexch_failure_order(memory_order_seq_cst);
      switch(0x2165ddd) {
      default:
        if (mVar4 - memory_order_consume < 2) {
          LOCK();
          _Var7 = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
          bVar3 = rest == _Var7;
          if (bVar3) {
            (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pvVar6;
            _Var7 = rest;
          }
          UNLOCK();
          if (!bVar3) {
            rest = _Var7;
          }
        }
        else if (mVar4 == memory_order_seq_cst) {
          LOCK();
          _Var7 = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
          bVar3 = rest == _Var7;
          if (bVar3) {
            (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pvVar6;
            _Var7 = rest;
          }
          UNLOCK();
          if (!bVar3) {
            rest = _Var7;
          }
        }
        else {
          LOCK();
          _Var7 = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
          bVar3 = rest == _Var7;
          if (bVar3) {
            (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pvVar6;
            _Var7 = rest;
          }
          UNLOCK();
          if (!bVar3) {
            rest = _Var7;
          }
        }
        break;
      case 2:
        if (mVar4 - memory_order_consume < 2) {
          LOCK();
          _Var7 = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
          bVar3 = rest == _Var7;
          if (bVar3) {
            (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pvVar6;
            _Var7 = rest;
          }
          UNLOCK();
          if (!bVar3) {
            rest = _Var7;
          }
        }
        else if (mVar4 == memory_order_seq_cst) {
          LOCK();
          _Var7 = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
          bVar3 = rest == _Var7;
          if (bVar3) {
            (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pvVar6;
            _Var7 = rest;
          }
          UNLOCK();
          if (!bVar3) {
            rest = _Var7;
          }
        }
        else {
          LOCK();
          _Var7 = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
          bVar3 = rest == _Var7;
          if (bVar3) {
            (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pvVar6;
            _Var7 = rest;
          }
          UNLOCK();
          if (!bVar3) {
            rest = _Var7;
          }
        }
        break;
      case 3:
        if (mVar4 - memory_order_consume < 2) {
          LOCK();
          _Var7 = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
          bVar3 = rest == _Var7;
          if (bVar3) {
            (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pvVar6;
            _Var7 = rest;
          }
          UNLOCK();
          if (!bVar3) {
            rest = _Var7;
          }
        }
        else if (mVar4 == memory_order_seq_cst) {
          LOCK();
          _Var7 = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
          bVar3 = rest == _Var7;
          if (bVar3) {
            (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pvVar6;
            _Var7 = rest;
          }
          UNLOCK();
          if (!bVar3) {
            rest = _Var7;
          }
        }
        else {
          LOCK();
          _Var7 = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
          bVar3 = rest == _Var7;
          if (bVar3) {
            (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pvVar6;
            _Var7 = rest;
          }
          UNLOCK();
          if (!bVar3) {
            rest = _Var7;
          }
        }
        break;
      case 4:
        if (mVar4 - memory_order_consume < 2) {
          LOCK();
          _Var7 = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
          bVar3 = rest == _Var7;
          if (bVar3) {
            (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pvVar6;
            _Var7 = rest;
          }
          UNLOCK();
          if (!bVar3) {
            rest = _Var7;
          }
        }
        else if (mVar4 == memory_order_seq_cst) {
          LOCK();
          _Var7 = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
          bVar3 = rest == _Var7;
          if (bVar3) {
            (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pvVar6;
            _Var7 = rest;
          }
          UNLOCK();
          if (!bVar3) {
            rest = _Var7;
          }
        }
        else {
          LOCK();
          _Var7 = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
          bVar3 = rest == _Var7;
          if (bVar3) {
            (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pvVar6;
            _Var7 = rest;
          }
          UNLOCK();
          if (!bVar3) {
            rest = _Var7;
          }
        }
      }
      _Var7 = rest;
    } while (!bVar3);
    raw_atomic_store((uintptr_t *)future_tail,page_start + i_control_bits,memory_order_seq_cst);
    uVar2 = page_start;
    mVar4 = std::__cmpexch_failure_order(memory_order_seq_cst);
    switch(0x21664e7) {
    default:
      if (mVar4 - memory_order_consume < 2) {
        LOCK();
        pvVar6 = (void *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar3 = user_storage == pvVar6;
        if (bVar3) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar2;
          pvVar6 = user_storage;
        }
        UNLOCK();
        if (!bVar3) {
          user_storage = pvVar6;
        }
      }
      else if (mVar4 == memory_order_seq_cst) {
        LOCK();
        pvVar6 = (void *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar3 = user_storage == pvVar6;
        if (bVar3) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar2;
          pvVar6 = user_storage;
        }
        UNLOCK();
        if (!bVar3) {
          user_storage = pvVar6;
        }
      }
      else {
        LOCK();
        pvVar6 = (void *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar3 = user_storage == pvVar6;
        if (bVar3) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar2;
          pvVar6 = user_storage;
        }
        UNLOCK();
        if (!bVar3) {
          user_storage = pvVar6;
        }
      }
      break;
    case 2:
      if (mVar4 - memory_order_consume < 2) {
        LOCK();
        pvVar6 = (void *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar3 = user_storage == pvVar6;
        if (bVar3) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar2;
          pvVar6 = user_storage;
        }
        UNLOCK();
        if (!bVar3) {
          user_storage = pvVar6;
        }
      }
      else if (mVar4 == memory_order_seq_cst) {
        LOCK();
        pvVar6 = (void *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar3 = user_storage == pvVar6;
        if (bVar3) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar2;
          pvVar6 = user_storage;
        }
        UNLOCK();
        if (!bVar3) {
          user_storage = pvVar6;
        }
      }
      else {
        LOCK();
        pvVar6 = (void *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar3 = user_storage == pvVar6;
        if (bVar3) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar2;
          pvVar6 = user_storage;
        }
        UNLOCK();
        if (!bVar3) {
          user_storage = pvVar6;
        }
      }
      break;
    case 3:
      if (mVar4 - memory_order_consume < 2) {
        LOCK();
        pvVar6 = (void *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar3 = user_storage == pvVar6;
        if (bVar3) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar2;
          pvVar6 = user_storage;
        }
        UNLOCK();
        if (!bVar3) {
          user_storage = pvVar6;
        }
      }
      else if (mVar4 == memory_order_seq_cst) {
        LOCK();
        pvVar6 = (void *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar3 = user_storage == pvVar6;
        if (bVar3) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar2;
          pvVar6 = user_storage;
        }
        UNLOCK();
        if (!bVar3) {
          user_storage = pvVar6;
        }
      }
      else {
        LOCK();
        pvVar6 = (void *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar3 = user_storage == pvVar6;
        if (bVar3) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar2;
          pvVar6 = user_storage;
        }
        UNLOCK();
        if (!bVar3) {
          user_storage = pvVar6;
        }
      }
      break;
    case 4:
      if (mVar4 - memory_order_consume < 2) {
        LOCK();
        pvVar6 = (void *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar3 = user_storage == pvVar6;
        if (bVar3) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar2;
          pvVar6 = user_storage;
        }
        UNLOCK();
        if (!bVar3) {
          user_storage = pvVar6;
        }
      }
      else if (mVar4 == memory_order_seq_cst) {
        LOCK();
        pvVar6 = (void *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar3 = user_storage == pvVar6;
        if (bVar3) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar2;
          pvVar6 = user_storage;
        }
        UNLOCK();
        if (!bVar3) {
          user_storage = pvVar6;
        }
      }
      else {
        LOCK();
        pvVar6 = (void *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar3 = user_storage == pvVar6;
        if (bVar3) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar2;
          pvVar6 = user_storage;
        }
        UNLOCK();
        if (!bVar3) {
          user_storage = pvVar6;
        }
      }
    }
    pvVar6 = address_add((void *)future_tail,i_offset);
    local_1c8 = address_upper_align(pvVar6,sStack_150);
    LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
    ::Allocation::Allocation
              (__return_storage_ptr__,(LfQueueControl *)future_tail,page_start + i_control_bits,
               local_1c8);
  }
  else {
    LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
    ::external_allocate<(density::detail::LfQueue_ProgressGuarantee)0>
              (__return_storage_ptr__,
               (LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
                *)this,i_control_bits,i_alignment_local,sStack_150);
  }
LAB_0216739f:
  local_1cc = 1;
  PinGuard<density::basic_default_allocator<65536UL>,_(density::progress_guarantee)0>::~PinGuard
            ((PinGuard<density::basic_default_allocator<65536UL>,_(density::progress_guarantee)0> *)
             local_180);
  return __return_storage_ptr__;
}

Assistant:

Allocation try_inplace_allocate_impl(
              uintptr_t i_control_bits,
              bool      i_include_type,
              size_t    i_size,
              size_t    i_alignment) noexcept(PROGRESS_GUARANTEE != LfQueue_Throwing)
            {
                auto guarantee =
                  PROGRESS_GUARANTEE; // used to avoid warnings about constant conditional expressions

                DENSITY_ASSERT_INTERNAL(
                  (i_control_bits & ~(LfQueue_Busy | LfQueue_Dead | LfQueue_External)) == 0);
                DENSITY_ASSERT_INTERNAL(is_power_of_2(i_alignment) && (i_size % i_alignment) == 0);

                if (i_alignment < min_alignment)
                {
                    i_alignment = min_alignment;
                    i_size      = uint_upper_align(i_size, min_alignment);
                }

                auto const overhead = i_include_type ? s_element_min_offset : s_rawblock_min_offset;
                auto const required_size = overhead + i_size + (i_alignment - min_alignment);
                auto const required_units =
                  (required_size + (s_alloc_granularity - 1)) / s_alloc_granularity;

                // instantiate a pin-guard - we will use it only in case of contention
                PinGuard<ALLOCATOR_TYPE, ToDenGuarantee(PROGRESS_GUARANTEE)> scoped_pin(this);

                bool const fits_in_page =
                  required_units <
                  size_min(s_alloc_granularity, s_end_control_offset / s_alloc_granularity);
                if (fits_in_page)
                {
                    auto tail = m_tail.load(mem_relaxed);
                    for (;;)
                    {
                        static_assert(is_power_of_2(s_alloc_granularity), "");
                        auto const rest = tail & (s_alloc_granularity - 1);
                        if (rest == 0)
                        {
                            // we can try the allocation
                            auto const new_control = reinterpret_cast<ControlBlock *>(tail);
                            auto const future_tail = tail + required_units * s_alloc_granularity;
                            auto const page_start =
                              uint_lower_align(tail, ALLOCATOR_TYPE::page_alignment);
                            auto const future_tail_offset = future_tail - page_start;
                            auto       transient_tail     = tail + required_units;
                            if (DENSITY_LIKELY(future_tail_offset <= s_end_control_offset))
                            {
                                DENSITY_ASSUME(required_units < s_alloc_granularity);
                                if (m_tail.compare_exchange_weak(tail, transient_tail, mem_relaxed))
                                {
                                    raw_atomic_store(
                                      &new_control->m_next,
                                      future_tail + i_control_bits,
                                      mem_relaxed);

                                    m_tail.compare_exchange_strong(
                                      transient_tail, future_tail, mem_relaxed);

                                    auto const user_storage = address_upper_align(
                                      address_add(new_control, overhead), i_alignment);
                                    DENSITY_ASSUME(
                                      reinterpret_cast<uintptr_t>(user_storage) + i_size <=
                                      future_tail);
                                    return Allocation{
                                      new_control, future_tail + i_control_bits, user_storage};
                                }
                                else
                                {
                                    if (guarantee == LfQueue_WaitFree)
                                    {
                                        return Allocation{};
                                    }
                                }
                            }
                            else
                            {
                                tail = page_overflow(guarantee, tail);

                                if (guarantee != LfQueue_Throwing)
                                {
                                    if (tail == 0)
                                    {
                                        return Allocation{};
                                    }
                                }
                                else
                                {
                                    DENSITY_ASSUME(tail != 0);
                                }
                            }
                        }
                        else
                        {
                            // the memory protection currently used (pinning) is based on an atomic increment, that is not wait-free
                            if (guarantee == LfQueue_WaitFree)
                            {
                                return Allocation{};
                            }

                            // an allocation is in progress, we help it
                            auto const clean_tail = tail - rest;
                            auto const incomplete_control =
                              reinterpret_cast<ControlBlock *>(clean_tail);
                            auto const next = clean_tail + rest * s_alloc_granularity;

                            auto const pin_result = scoped_pin.pin(incomplete_control);
                            if (pin_result != AlreadyPinned)
                            {
                                if (pin_result == PinFailed)
                                {
                                    return Allocation{};
                                }
                                auto updated_tail = m_tail.load(mem_relaxed);
                                if (updated_tail != tail)
                                {
                                    tail = updated_tail;
                                    continue;
                                }
                            }

                            // Note: NEEDS ZEROED-PAGES
                            uintptr_t expected_next = 0;
                            raw_atomic_compare_exchange_weak(
                              &incomplete_control->m_next,
                              &expected_next,
                              uintptr_t(next + LfQueue_Busy),
                              mem_relaxed);
                            if (m_tail.compare_exchange_weak(tail, next, mem_relaxed))
                            {
                                tail = next;
                            }
                        }
                    }
                }
                else
                {
                    // legacy heap allocations can only be blocking
                    if (guarantee == LfQueue_LockFree || guarantee == LfQueue_WaitFree)
                        return Allocation{};

                    return Base::template external_allocate<PROGRESS_GUARANTEE>(
                      i_control_bits, i_size, i_alignment);
                }
            }